

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O2

VectorU * anurbs::HilbertCurve<3L>::point_at(VectorU *__return_storage_ptr__,size_t m,size_t h)

{
  size_t sVar1;
  Scalar *pSVar2;
  Index j;
  long lVar3;
  long lVar4;
  size_t w;
  ulong i;
  Index j_1;
  ulong index;
  ulong local_58;
  size_t local_48;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
  local_40 [16];
  
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<unsigned_long,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,3,1,1,3>>>
            ((PlainObjectBase<Eigen::Matrix<unsigned_long,1,3,1,1,3>> *)__return_storage_ptr__,
             local_40);
  lVar4 = m * 3;
  local_58 = 0;
  local_48 = 0;
  while( true ) {
    lVar4 = lVar4 + -3;
    m = m - 1;
    if ((long)m < 0) break;
    i = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      i = i + ((ulong)((h >> ((ulong)(uint)((int)lVar4 + (int)lVar3) & 0x3f) & 1) != 0) <<
              ((byte)lVar3 & 0x3f));
    }
    sVar1 = inverse_t(local_48,local_58,i >> 1 ^ i);
    for (index = 0; index != 3; index = index + 1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1> *)
                          __return_storage_ptr__,index);
      *pSVar2 = *pSVar2 + ((ulong)((sVar1 >> (index & 0x3f) & 1) != 0) << ((byte)m & 0x3f));
    }
    sVar1 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
    if (i == 0) {
      sVar1 = 0;
    }
    sVar1 = rol(sVar1,local_58 + 1);
    local_48 = local_48 ^ sVar1;
    sVar1 = d(i);
    local_58 = (sVar1 + local_58 + 1) % 3;
  }
  return __return_storage_ptr__;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }